

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib1523.c
# Opt level: O0

int test(char *URL)

{
  CURLcode CVar1;
  CURL *hnd_00;
  time_t tVar2;
  undefined1 local_128 [8];
  char buffer [256];
  CURL *hnd;
  CURLcode ret;
  char *URL_local;
  
  hnd_00 = (CURL *)curl_easy_init();
  curl_easy_setopt(hnd_00,0x2712,URL);
  curl_easy_setopt(hnd_00,0x4e2b,write_cb);
  curl_easy_setopt(hnd_00,0x271a,local_128);
  curl_easy_setopt(hnd_00,0x2b,0);
  curl_easy_setopt(hnd_00,0x4efb,dload_progress_cb);
  tVar2 = time((time_t *)0x0);
  curl_mprintf("Start: %d\n",tVar2);
  CVar1 = run(hnd_00,1,2);
  if (CVar1 != CURLE_OK) {
    curl_mfprintf(_stderr,"error %d: %s\n",CVar1,local_128);
  }
  hnd._4_4_ = run(hnd_00,12000,1);
  if (hnd._4_4_ == CURLE_OPERATION_TIMEDOUT) {
    hnd._4_4_ = CURLE_OK;
  }
  else {
    curl_mfprintf(_stderr,"error %d: %s\n",hnd._4_4_,local_128);
  }
  tVar2 = time((time_t *)0x0);
  curl_mprintf("End: %d\n",tVar2);
  curl_easy_cleanup(hnd_00);
  return hnd._4_4_;
}

Assistant:

int test(char *URL)
{
  CURLcode ret;
  CURL *hnd = curl_easy_init();
  char buffer[CURL_ERROR_SIZE];
  curl_easy_setopt(hnd, CURLOPT_URL, URL);
  curl_easy_setopt(hnd, CURLOPT_WRITEFUNCTION, write_cb);
  curl_easy_setopt(hnd, CURLOPT_ERRORBUFFER, buffer);
  curl_easy_setopt(hnd, CURLOPT_NOPROGRESS, 0L);
  curl_easy_setopt(hnd, CURLOPT_XFERINFOFUNCTION, dload_progress_cb);

  printf("Start: %d\n", time(NULL));
  ret = run(hnd, 1, 2);
  if(ret)
    fprintf(stderr, "error %d: %s\n", ret, buffer);

  ret = run(hnd, 12000, 1);
  if(ret != CURLE_OPERATION_TIMEDOUT)
    fprintf(stderr, "error %d: %s\n", ret, buffer);
  else
    ret = 0;

  printf("End: %d\n", time(NULL));
  curl_easy_cleanup(hnd);

  return (int)ret;
}